

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v4.cxx
# Opt level: O1

bool __thiscall xray_re::xr_ogf_v4::load_omf(xr_ogf_v4 *this,char *path)

{
  int iVar1;
  xr_reader *r;
  
  if ((xr_file_system::instance()::instance0 == '\0') &&
     (iVar1 = __cxa_guard_acquire(&xr_file_system::instance()::instance0), iVar1 != 0)) {
    xr_file_system::xr_file_system(&xr_file_system::instance::instance0);
    __cxa_atexit(xr_file_system::~xr_file_system,&xr_file_system::instance::instance0,&__dso_handle)
    ;
    __cxa_guard_release(&xr_file_system::instance()::instance0);
  }
  r = xr_file_system::r_open(&xr_file_system::instance::instance0,path);
  if (r != (xr_reader *)0x0) {
    load_omf(this,r);
    (*r->_vptr_xr_reader[1])(r);
  }
  return r != (xr_reader *)0x0;
}

Assistant:

bool xr_ogf_v4::load_omf(const char* path)
{
	xr_file_system& fs = xr_file_system::instance();
	xr_reader* r = fs.r_open(path);
	if (r == 0)
		return false;

	bool status = true;
	try {
		load_omf(*r);
	} catch (xr_error) {
		clear();
		status = false;
	}
	fs.r_close(r);
	return status;
}